

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O3

void Js::AsmJsByteCodeDumper::
     DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCodeAsmJs op,OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data
               ,FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  byte bVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  undefined6 in_register_0000003a;
  char16_t *pcVar6;
  undefined1 local_28 [8];
  WAsmJsMemTag tag;
  
  InitializeWAsmJsMemTag(data->ViewType,(WAsmJsMemTag *)local_28);
  switch((int)CONCAT62(in_register_0000003a,op)) {
  case 0x5c:
    bVar1 = data->Value;
    uVar2 = data->SlotIndex;
    pcVar6 = L" %c%d = %s[I%d]";
    break;
  case 0x5d:
    bVar1 = data->Value;
    uVar2 = data->SlotIndex;
    pcVar6 = L" %c%d = %s[%d]";
    break;
  case 0x5e:
    uVar2 = data->SlotIndex;
    bVar1 = data->Value;
    pcVar6 = L" %s[I%d] = %c%d";
    goto LAB_007d5a5e;
  case 0x5f:
    uVar2 = data->SlotIndex;
    bVar1 = data->Value;
    pcVar6 = L" %s[%d] = %c%d";
LAB_007d5a5e:
    Output::Print(pcVar6,tag._0_8_,(ulong)uVar2,(ulong)(ushort)local_28._0_2_,(ulong)bVar1);
    return;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x23b,"((0))","(0)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    return;
  }
  Output::Print(pcVar6,(ulong)(ushort)local_28._0_2_,(ulong)bVar1,tag._0_8_,(ulong)uVar2);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpAsmTypedArr(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        WAsmJsMemTag tag;
        InitializeWAsmJsMemTag(data->ViewType, &tag);
        switch (op)
        {
        case OpCodeAsmJs::LdArr:
            Output::Print(_u(" %c%d = %s[I%d]"), tag.valueTag, data->Value, tag.heapTag, data->SlotIndex); break;
        case OpCodeAsmJs::LdArrConst:
            Output::Print(_u(" %c%d = %s[%d]"), tag.valueTag, data->Value, tag.heapTag, data->SlotIndex); break;
        case OpCodeAsmJs::StArr:
            Output::Print(_u(" %s[I%d] = %c%d"), tag.heapTag, data->SlotIndex, tag.valueTag, data->Value); break;
        case OpCodeAsmJs::StArrConst:
            Output::Print(_u(" %s[%d] = %c%d"), tag.heapTag, data->SlotIndex, tag.valueTag, data->Value); break;
        default:
            Assume(UNREACHED);
        }
    }